

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O3

void google::protobuf::TestUtil::ModifyRepeatedFields<proto2_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  RepeatedField<int> *pRVar1;
  RepeatedField<long> *pRVar2;
  RepeatedField<unsigned_int> *pRVar3;
  RepeatedField<unsigned_long> *pRVar4;
  RepeatedField<float> *this;
  RepeatedField<double> *this_00;
  RepeatedField<bool> *this_01;
  bool bVar5;
  int iVar6;
  int *piVar7;
  long *plVar8;
  uint *puVar9;
  unsigned_long *puVar10;
  float *pfVar11;
  double *pdVar12;
  bool *pbVar13;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar14;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>_>
  *pVVar15;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>_>
  *pVVar16;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>_> *pVVar17;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>_>
  *pVVar18;
  FieldDescriptor *pFVar19;
  Metadata MVar20;
  Metadata MVar21;
  string_view name;
  string_view name_00;
  string local_68;
  string local_48;
  
  pRVar1 = &(message->field_0)._impl_.repeated_int32_;
  iVar6 = protobuf::internal::SooRep::size
                    (&pRVar1->soo_rep_,
                     (undefined1  [816])
                     ((undefined1  [816])message->field_0 & (undefined1  [816])0x4) ==
                     (undefined1  [816])0x0);
  if (iVar6 < 2) {
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_007233fd:
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_00723407:
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_00723411:
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_0072341b:
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_00723425:
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_0072342f:
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_00723439:
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_00723443:
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_0072344d:
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_00723457:
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_00723461:
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_0072346b:
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_00723475:
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_0072347f:
    ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
  }
  else {
    piVar7 = RepeatedField<int>::elements
                       (pRVar1,(undefined1  [816])
                               ((undefined1  [816])message->field_0 & (undefined1  [816])0x4) ==
                               (undefined1  [816])0x0);
    piVar7[1] = 0x1f5;
    pRVar2 = &(message->field_0)._impl_.repeated_int64_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar2->soo_rep_,(*(byte *)((long)&message->field_0 + 0x20) & 4) == 0);
    if (iVar6 < 2) goto LAB_007233fd;
    plVar8 = RepeatedField<long>::elements
                       (pRVar2,(*(byte *)((long)&message->field_0 + 0x20) & 4) == 0);
    plVar8[1] = 0x1f6;
    pRVar3 = &(message->field_0)._impl_.repeated_uint32_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar3->soo_rep_,(*(byte *)((long)&message->field_0 + 0x30) & 4) == 0);
    if (iVar6 < 2) goto LAB_00723407;
    puVar9 = RepeatedField<unsigned_int>::elements
                       (pRVar3,(*(byte *)((long)&message->field_0 + 0x30) & 4) == 0);
    puVar9[1] = 0x1f7;
    pRVar4 = &(message->field_0)._impl_.repeated_uint64_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar4->soo_rep_,(*(byte *)((long)&message->field_0 + 0x40) & 4) == 0);
    if (iVar6 < 2) goto LAB_00723411;
    puVar10 = RepeatedField<unsigned_long>::elements
                        (pRVar4,(*(byte *)((long)&message->field_0 + 0x40) & 4) == 0);
    puVar10[1] = 0x1f8;
    pRVar1 = &(message->field_0)._impl_.repeated_sint32_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&message->field_0 + 0x50) & 4) == 0);
    if (iVar6 < 2) goto LAB_0072341b;
    piVar7 = RepeatedField<int>::elements
                       (pRVar1,(*(byte *)((long)&message->field_0 + 0x50) & 4) == 0);
    piVar7[1] = 0x1f9;
    pRVar2 = &(message->field_0)._impl_.repeated_sint64_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar2->soo_rep_,(*(byte *)((long)&message->field_0 + 0x60) & 4) == 0);
    if (iVar6 < 2) goto LAB_00723425;
    plVar8 = RepeatedField<long>::elements
                       (pRVar2,(*(byte *)((long)&message->field_0 + 0x60) & 4) == 0);
    plVar8[1] = 0x1fa;
    pRVar3 = &(message->field_0)._impl_.repeated_fixed32_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar3->soo_rep_,(*(byte *)((long)&message->field_0 + 0x70) & 4) == 0);
    if (iVar6 < 2) goto LAB_0072342f;
    puVar9 = RepeatedField<unsigned_int>::elements
                       (pRVar3,(*(byte *)((long)&message->field_0 + 0x70) & 4) == 0);
    puVar9[1] = 0x1fb;
    pRVar4 = &(message->field_0)._impl_.repeated_fixed64_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar4->soo_rep_,(*(byte *)((long)&message->field_0 + 0x80) & 4) == 0);
    if (iVar6 < 2) goto LAB_00723439;
    puVar10 = RepeatedField<unsigned_long>::elements
                        (pRVar4,(*(byte *)((long)&message->field_0 + 0x80) & 4) == 0);
    puVar10[1] = 0x1fc;
    pRVar1 = &(message->field_0)._impl_.repeated_sfixed32_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&message->field_0 + 0x90) & 4) == 0);
    if (iVar6 < 2) goto LAB_00723443;
    piVar7 = RepeatedField<int>::elements
                       (pRVar1,(*(byte *)((long)&message->field_0 + 0x90) & 4) == 0);
    piVar7[1] = 0x1fd;
    pRVar2 = &(message->field_0)._impl_.repeated_sfixed64_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar2->soo_rep_,(*(byte *)((long)&message->field_0 + 0xa0) & 4) == 0);
    if (iVar6 < 2) goto LAB_0072344d;
    plVar8 = RepeatedField<long>::elements
                       (pRVar2,(*(byte *)((long)&message->field_0 + 0xa0) & 4) == 0);
    plVar8[1] = 0x1fe;
    this = &(message->field_0)._impl_.repeated_float_;
    iVar6 = protobuf::internal::SooRep::size
                      (&this->soo_rep_,(*(byte *)((long)&message->field_0 + 0xb0) & 4) == 0);
    if (iVar6 < 2) goto LAB_00723457;
    pfVar11 = RepeatedField<float>::elements
                        (this,(*(byte *)((long)&message->field_0 + 0xb0) & 4) == 0);
    pfVar11[1] = 511.0;
    this_00 = &(message->field_0)._impl_.repeated_double_;
    iVar6 = protobuf::internal::SooRep::size
                      (&this_00->soo_rep_,(*(byte *)((long)&message->field_0 + 0xc0) & 4) == 0);
    if (iVar6 < 2) goto LAB_00723461;
    pdVar12 = RepeatedField<double>::elements
                        (this_00,(*(byte *)((long)&message->field_0 + 0xc0) & 4) == 0);
    pdVar12[1] = 512.0;
    this_01 = &(message->field_0)._impl_.repeated_bool_;
    iVar6 = protobuf::internal::SooRep::size
                      (&this_01->soo_rep_,(*(byte *)((long)&message->field_0 + 0xd0) & 4) == 0);
    if (iVar6 < 2) goto LAB_0072346b;
    pbVar13 = RepeatedField<bool>::elements
                        (this_01,(*(byte *)((long)&message->field_0 + 0xd0) & 4) == 0);
    pbVar13[1] = true;
    pVVar14 = protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                        (&(message->field_0)._impl_.repeated_string_.super_RepeatedPtrFieldBase,1);
    std::__cxx11::string::_M_replace((ulong)pVVar14,0,(char *)pVVar14->_M_string_length,0x10f4711);
    pVVar14 = protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                        (&(message->field_0)._impl_.repeated_bytes_.super_RepeatedPtrFieldBase,1);
    std::__cxx11::string::_M_replace((ulong)pVVar14,0,(char *)pVVar14->_M_string_length,0x10f4715);
    pVVar15 = protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_RepeatedGroup>>
                        (&(message->field_0)._impl_.repeatedgroup_.super_RepeatedPtrFieldBase,1);
    (pVVar15->field_0)._impl_.a_ = 0x205;
    *(byte *)&pVVar15->field_0 = *(byte *)&pVVar15->field_0 | 1;
    pVVar16 = protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                        (&(message->field_0)._impl_.repeated_nested_message_.
                          super_RepeatedPtrFieldBase,1);
    (pVVar16->field_0)._impl_.bb_ = 0x206;
    *(byte *)&pVVar16->field_0 = *(byte *)&pVVar16->field_0 | 1;
    pVVar17 = protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest::ForeignMessage>>
                        (&(message->field_0)._impl_.repeated_foreign_message_.
                          super_RepeatedPtrFieldBase,1);
    (pVVar17->field_0)._impl_.c_ = 0x207;
    *(byte *)&pVVar17->field_0 = *(byte *)&pVVar17->field_0 | 1;
    pVVar18 = protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>>
                        (&(message->field_0)._impl_.repeated_import_message_.
                          super_RepeatedPtrFieldBase,1);
    (pVVar18->field_0)._impl_.d_ = 0x208;
    *(byte *)&pVVar18->field_0 = *(byte *)&pVVar18->field_0 | 1;
    pVVar16 = protobuf::internal::RepeatedPtrFieldBase::
              Mutable<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
                        (&(message->field_0)._impl_.repeated_lazy_message_.
                          super_RepeatedPtrFieldBase,1);
    (pVVar16->field_0)._impl_.bb_ = 0x20f;
    *(byte *)&pVVar16->field_0 = *(byte *)&pVVar16->field_0 | 1;
    bVar5 = protobuf::internal::ValidateEnum
                      (1,(uint32_t *)proto2_unittest::TestAllTypes_NestedEnum_internal_data_);
    if (!bVar5) goto LAB_00723493;
    pRVar1 = &(message->field_0)._impl_.repeated_nested_enum_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&message->field_0 + 0x170) & 4) == 0);
    if (iVar6 < 2) goto LAB_00723475;
    piVar7 = RepeatedField<int>::elements
                       (pRVar1,(undefined1  [16])
                               ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4
                               ) == (undefined1  [16])0x0);
    piVar7[1] = 1;
    bVar5 = protobuf::internal::ValidateEnum
                      (4,(uint32_t *)proto2_unittest::ForeignEnum_internal_data_);
    if (!bVar5) {
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::ForeignEnum_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest.pb.h"
                    ,0xbaca,
                    "void proto2_unittest::TestAllTypes::set_repeated_foreign_enum(int, ::proto2_unittest::ForeignEnum)"
                   );
    }
    pRVar1 = &(message->field_0)._impl_.repeated_foreign_enum_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&message->field_0 + 0x180) & 4) == 0);
    if (iVar6 < 2) goto LAB_0072347f;
    piVar7 = RepeatedField<int>::elements
                       (pRVar1,(undefined1  [16])
                               ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4
                               ) == (undefined1  [16])0x0);
    piVar7[1] = 4;
    bVar5 = protobuf::internal::ValidateEnum
                      (7,(uint32_t *)&proto2_unittest_import::ImportEnum_internal_data_);
    if (!bVar5) {
      __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest_import::ImportEnum_internal_data_)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest.pb.h"
                    ,0xbafe,
                    "void proto2_unittest::TestAllTypes::set_repeated_import_enum(int, ::proto2_unittest_import::ImportEnum)"
                   );
    }
    pRVar1 = &(message->field_0)._impl_.repeated_import_enum_;
    iVar6 = protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&message->field_0 + 400) & 4) == 0);
    if (1 < iVar6) {
      piVar7 = RepeatedField<int>::elements
                         (pRVar1,(*(byte *)((long)&message->field_0 + 400) & 4) == 0);
      piVar7[1] = 7;
      MVar20 = proto2_unittest::TestAllTypes::GetMetadata
                         ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
      MVar21 = proto2_unittest::TestAllTypes::GetMetadata
                         ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
      name._M_str = "repeated_string_piece";
      name._M_len = 0x15;
      pFVar19 = Descriptor::FindFieldByName(MVar21.descriptor,name);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"524","");
      Reflection::SetRepeatedString(MVar20.reflection,&message->super_Message,pFVar19,1,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      MVar20 = proto2_unittest::TestAllTypes::GetMetadata
                         ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
      MVar21 = proto2_unittest::TestAllTypes::GetMetadata
                         ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
      name_00._M_str = "repeated_cord";
      name_00._M_len = 0xd;
      pFVar19 = Descriptor::FindFieldByName(MVar21.descriptor,name_00);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"525","");
      Reflection::SetRepeatedString(MVar20.reflection,&message->super_Message,pFVar19,1,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  }
  ModifyRepeatedFields<proto2_unittest::TestAllTypes>();
LAB_00723493:
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::TestAllTypes_NestedEnum_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest.pb.h"
                ,0xba96,
                "void proto2_unittest::TestAllTypes::set_repeated_nested_enum(int, ::proto2_unittest::TestAllTypes_NestedEnum)"
               );
}

Assistant:

void ModifyRepeatedFields(TestAllTypes* message) {
  message->set_repeated_int32(1, 501);
  message->set_repeated_int64(1, 502);
  message->set_repeated_uint32(1, 503);
  message->set_repeated_uint64(1, 504);
  message->set_repeated_sint32(1, 505);
  message->set_repeated_sint64(1, 506);
  message->set_repeated_fixed32(1, 507);
  message->set_repeated_fixed64(1, 508);
  message->set_repeated_sfixed32(1, 509);
  message->set_repeated_sfixed64(1, 510);
  message->set_repeated_float(1, 511);
  message->set_repeated_double(1, 512);
  message->set_repeated_bool(1, true);
  message->set_repeated_string(1, "515");
  message->set_repeated_bytes(1, "516");

  message->mutable_repeatedgroup(1)->set_a(517);
  message->mutable_repeated_nested_message(1)->set_bb(518);
  message->mutable_repeated_foreign_message(1)->set_c(519);
  message->mutable_repeated_import_message(1)->set_d(520);
  message->mutable_repeated_lazy_message(1)->set_bb(527);

  message->set_repeated_nested_enum(1, TestAllTypes::FOO);
  message->set_repeated_foreign_enum(1, ForeignEnum<TestAllTypes>::FOREIGN_FOO);
  message->set_repeated_import_enum(1, ImportEnum<TestAllTypes>::IMPORT_FOO);

#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  message->GetReflection()->SetRepeatedString(
      message,
      message->GetDescriptor()->FindFieldByName("repeated_string_piece"), 1,
      "524");
  message->GetReflection()->SetRepeatedString(
      message, message->GetDescriptor()->FindFieldByName("repeated_cord"), 1,
      "525");
#endif  // !PROTOBUF_TEST_NO_DESCRIPTORS
}